

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O2

void henson::Serialization<henson::Scheduler::Job>::save(BinaryBuffer *bb,Job *j)

{
  (**bb->_vptr_BinaryBuffer)(bb,j,8);
  Serialization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  save(bb,&j->name);
  Serialization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  save(bb,&j->function);
  Serialization<henson::MemoryBuffer>::save(bb,&j->arg);
  Serialization<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::save(bb,&j->groups);
  (**bb->_vptr_BinaryBuffer)(bb,&j->size,8);
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Scheduler::Job& j)
    {
        henson::save(bb, j.id);
        henson::save(bb, j.name);
        henson::save(bb, j.function);
        henson::save(bb, j.arg);
        henson::save(bb, j.groups);
        henson::save(bb, j.size);
    }